

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  bool bVar1;
  char *str;
  char *in_RDX;
  Int32 IVar2;
  Int32 result;
  string env_var;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  Int32 local_5c;
  string local_58;
  string local_38;
  
  FlagToEnvVar_abi_cxx11_(&local_38,(internal *)flag,in_RDX);
  str = getenv(local_38._M_dataplus._M_p);
  IVar2 = default_value;
  if (str != (char *)0x0) {
    local_5c = default_value;
    Message::Message((Message *)&local_58);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_58._M_dataplus._M_p + 0x10),"Environment variable ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_58._M_dataplus._M_p + 0x10),local_38._M_dataplus._M_p,
               local_38._M_string_length);
    bVar1 = ParseInt32((Message *)&local_58,str,&local_5c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
      local_58._M_dataplus._M_p = (pointer)0x0;
    }
    IVar2 = local_5c;
    if (!bVar1) {
      Message::Message((Message *)&local_68);
      std::ostream::operator<<((ostream *)(local_68.ptr_ + 0x10),default_value);
      StringStreamToString(&local_58,local_68.ptr_);
      printf("The default value %s is used.\n",local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_68.ptr_ != (stringstream *)0x0) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
        local_68.ptr_ = (stringstream *)0x0;
      }
      fflush(_stdout);
      IVar2 = default_value;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return IVar2;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}